

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_render_pass_creation_control
          (Impl *this,Value *state,VkRenderPassCreationControlEXT **out_info)

{
  VkRenderPassCreationControlEXT *pVVar1;
  Type pGVar2;
  
  pVVar1 = (VkRenderPassCreationControlEXT *)
           ScratchAllocator::allocate_raw(&this->allocator,0x18,0x10);
  if (pVVar1 != (VkRenderPassCreationControlEXT *)0x0) {
    *(undefined8 *)pVVar1 = 0;
    pVVar1->pNext = (void *)0x0;
    *(undefined8 *)&pVVar1->disallowMerging = 0;
  }
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"disallowMerging");
  if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    pVVar1->disallowMerging = (pGVar2->data_).s.length;
    *out_info = pVVar1;
    return true;
  }
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x719,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_render_pass_creation_control(const Value &state, VkRenderPassCreationControlEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkRenderPassCreationControlEXT>();
	info->disallowMerging = state["disallowMerging"].GetUint();
	*out_info = info;
	return true;
}